

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O1

void __thiscall
MarkdownHighlighter::clearRangesForBlock(MarkdownHighlighter *this,int blockNumber,RangeType type)

{
  int iVar1;
  undefined4 uVar2;
  QList<MarkdownHighlighter::InlineRange> *this_00;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  InlineRange *pIVar6;
  long lVar7;
  int local_5c;
  QList<MarkdownHighlighter::InlineRange> local_58;
  QList<MarkdownHighlighter::InlineRange> local_38;
  
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (InlineRange *)0x0;
  local_58.d.size = 0;
  local_5c = blockNumber;
  QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::value
            (&local_38,&this->_ranges,&local_5c,&local_58);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,0xc,8);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0xc,8);
    }
  }
  if (local_38.d.size == 0) {
    return;
  }
  QSyntaxHighlighter::currentBlock();
  uVar2 = QTextBlock::blockNumber();
  local_58.d.d = (Data *)CONCAT44(local_58.d.d._4_4_,uVar2);
  this_00 = QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::operator[]
                      (&this->_ranges,(int *)&local_58);
  iVar3 = QList<MarkdownHighlighter::InlineRange>::begin(this_00);
  iVar4 = QList<MarkdownHighlighter::InlineRange>::end(this_00);
  lVar7 = ((long)iVar4.i - (long)iVar3.i >> 2) * -0x5555555555555555 >> 2;
  iVar5 = iVar3;
  if (0 < lVar7) {
    iVar5.i = iVar3.i + lVar7 * 4;
    lVar7 = lVar7 + 1;
    iVar3.i = iVar3.i + 2;
    do {
      if (iVar3.i[-2].type == type) {
        iVar3.i = iVar3.i + -2;
        goto LAB_00127af4;
      }
      if (iVar3.i[-1].type == type) {
        iVar3.i = iVar3.i + -1;
        goto LAB_00127af4;
      }
      if ((iVar3.i)->type == type) goto LAB_00127af4;
      if (iVar3.i[1].type == type) {
        iVar3.i = iVar3.i + 1;
        goto LAB_00127af4;
      }
      lVar7 = lVar7 + -1;
      iVar3.i = iVar3.i + 4;
    } while (1 < lVar7);
  }
  lVar7 = ((long)iVar4.i - (long)iVar5.i >> 2) * -0x5555555555555555;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      iVar3 = iVar4;
      if ((lVar7 != 3) || (iVar3.i = iVar5.i, (iVar5.i)->type == type)) goto LAB_00127af4;
      iVar5.i = iVar5.i + 1;
    }
    iVar3.i = iVar5.i;
    if ((iVar5.i)->type == type) goto LAB_00127af4;
    iVar5.i = iVar5.i + 1;
  }
  iVar3.i = iVar5.i;
  if ((iVar5.i)->type != type) {
    iVar3 = iVar4;
  }
LAB_00127af4:
  pIVar6 = iVar3.i + 1;
  if (pIVar6 != iVar4.i && iVar3.i != iVar4.i) {
    do {
      if (pIVar6->type != type) {
        (iVar3.i)->type = pIVar6->type;
        iVar1 = pIVar6->end;
        (iVar3.i)->begin = pIVar6->begin;
        (iVar3.i)->end = iVar1;
        iVar3.i = iVar3.i + 1;
      }
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != iVar4.i);
  }
  iVar5 = QList<MarkdownHighlighter::InlineRange>::end(this_00);
  QList<MarkdownHighlighter::InlineRange>::erase
            (this_00,(const_iterator)iVar3.i,(const_iterator)iVar5.i);
  return;
}

Assistant:

void MarkdownHighlighter::clearRangesForBlock(int blockNumber, RangeType type)
{
    if (!_ranges.value(blockNumber).isEmpty()) {
        auto& rangeList = _ranges[currentBlock().blockNumber()];
        rangeList.erase(std::remove_if(rangeList.begin(), rangeList.end(),
                                       [type](const InlineRange& range) {
           return range.type == type;
        }), rangeList.end());
    }
}